

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  Index source;
  uint birthPivot;
  Column *this_00;
  
  this_00 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
            ::get_column(&this->reducedMatrixR_,target);
  birthPivot = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
               ::get_pivot(this_00);
  while( true ) {
    if (birthPivot == 0xffffffff) {
      RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
      ::_add_bar((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                  *)this,(this->reducedMatrixR_).matrix_.
                         super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[target].
                         super_Column_dimension_option.dim_,eventIndex);
      return;
    }
    source = (this->pivotToColumnIndex_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[birthPivot];
    if (source == 0xffffffff) break;
    _reduce_column_by(this,target,source);
    birthPivot = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                 ::get_pivot(this_00);
  }
  (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start[birthPivot] = target;
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::_update_barcode((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                     *)this,birthPivot,eventIndex);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}